

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc_global.h
# Opt level: O1

void Abc_Print(int level,char *format,...)

{
  FILE *pFile;
  char in_AL;
  int iVar1;
  uchar *pBuffer;
  size_t sVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  __va_list_tag local_e8;
  undefined1 local_c8 [16];
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  if (in_AL != '\0') {
    local_98 = in_XMM0_Qa;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  if (enable_dbg_outs != 0) {
    local_b8 = in_RDX;
    local_b0 = in_RCX;
    local_a8 = in_R8;
    local_a0 = in_R9;
    iVar1 = Abc_FrameIsBridgeMode();
    if (iVar1 == 0) {
      if (level == -1) {
        printf("Error: ");
      }
    }
    else if (level == -1) {
      Gia_ManToBridgeText(_stdout,7,(uchar *)"Error: ");
    }
    local_e8.reg_save_area = local_c8;
    local_e8.overflow_arg_area = &args[0].overflow_arg_area;
    local_e8.gp_offset = 0x10;
    local_e8.fp_offset = 0x30;
    iVar1 = Abc_FrameIsBridgeMode();
    if (iVar1 == 0) {
      vprintf(format,&local_e8);
    }
    else {
      pBuffer = (uchar *)vnsprintf(format,&local_e8);
      pFile = _stdout;
      sVar2 = strlen((char *)pBuffer);
      Gia_ManToBridgeText(pFile,(int)sVar2,pBuffer);
      free(pBuffer);
    }
  }
  return;
}

Assistant:

static inline void Abc_Print( int level, const char * format, ... )
{
    extern ABC_DLL int Abc_FrameIsBridgeMode();
    va_list args;
    extern unsigned enable_dbg_outs;  
    if ( !enable_dbg_outs )
        return;

    if ( ! Abc_FrameIsBridgeMode() ){
        if ( level == ABC_ERROR )
            printf( "Error: " );
        else if ( level == ABC_WARNING )
            printf( "Warning: " );
    }else{
        if ( level == ABC_ERROR )
            Gia_ManToBridgeText( stdout, (int)strlen("Error: "), (unsigned char*)"Error: " );
        else if ( level == ABC_WARNING )
            Gia_ManToBridgeText( stdout, (int)strlen("Warning: "), (unsigned char*)"Warning: " );
    }

    va_start( args, format );
    if ( Abc_FrameIsBridgeMode() )
    {
        char * tmp = vnsprintf( format, args );
        Gia_ManToBridgeText( stdout, (int)strlen(tmp), (unsigned char*)tmp );
        free( tmp );
    }
    else
        vprintf( format, args );
    va_end( args );
}